

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

Vec_Int_t * Gia_SweeperGetCex(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = *(Vec_Int_t **)((long)p->pData + 0x50);
  if ((pVVar1 != (Vec_Int_t *)0x0) && (pVVar1->nSize != p->vCis->nSize - p->nRegs)) {
    __assert_fail("pSwp->vCexUser == NULL || Vec_IntSize(pSwp->vCexUser) == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0xe9,"Vec_Int_t *Gia_SweeperGetCex(Gia_Man_t *)");
  }
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_SweeperGetCex( Gia_Man_t * p )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    assert( pSwp->vCexUser == NULL || Vec_IntSize(pSwp->vCexUser) == Gia_ManPiNum(p) );
    return pSwp->vCexUser;
}